

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_key.cpp
# Opt level: O2

bool make_entry(value *val,string *type,string *algo,string *file,int bytes)

{
  uint uVar1;
  string *psVar2;
  copyable *pcVar3;
  ostream *poVar4;
  bool bVar5;
  allocator local_2b2;
  allocator local_2b1;
  value local_2b0;
  value local_2a8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string key;
  ofstream f;
  uint auStack_208 [120];
  
  cppcms::json::value::value<std::__cxx11::string>(local_2a8,algo);
  std::__cxx11::string::string((string *)&f,"session",(allocator *)&local_268);
  psVar2 = (string *)cppcms::json::value::operator[]((string *)val);
  std::__cxx11::string::string((string *)&key,"client",(allocator *)&local_288);
  psVar2 = (string *)cppcms::json::value::operator[](psVar2);
  pcVar3 = (copyable *)cppcms::json::value::operator[](psVar2);
  cppcms::json::value::copyable::operator=(pcVar3,&local_2a8[0].d);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&f);
  cppcms::json::value::copyable::~copyable(&local_2a8[0].d);
  make_key_abi_cxx11_(&key,bytes);
  if (file->_M_string_length == 0) {
    cppcms::json::value::value<std::__cxx11::string>((value *)&local_288,&key);
    std::__cxx11::string::string((string *)&f,"session",(allocator *)&local_2b0);
    psVar2 = (string *)cppcms::json::value::operator[]((string *)val);
    std::__cxx11::string::string((string *)local_2a8,"client",&local_2b2);
    psVar2 = (string *)cppcms::json::value::operator[](psVar2);
    std::operator+(&local_268,type,"_key");
    pcVar3 = (copyable *)cppcms::json::value::operator[](psVar2);
    cppcms::json::value::copyable::operator=(pcVar3,(copyable *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)&f);
    cppcms::json::value::copyable::~copyable((copyable *)&local_288);
  }
  else {
    std::ofstream::ofstream(&f,(file->_M_dataplus)._M_p,_S_out);
    uVar1 = *(uint *)((long)auStack_208 + *(long *)(_f + -0x18));
    if ((uVar1 & 5) == 0) {
      poVar4 = std::operator<<((ostream *)&f,(string *)&key);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ofstream::close();
      cppcms::json::value::value<std::__cxx11::string>(&local_2b0,file);
      std::__cxx11::string::string((string *)local_2a8,"session",&local_2b2);
      psVar2 = (string *)cppcms::json::value::operator[]((string *)val);
      std::__cxx11::string::string((string *)&local_268,"client",&local_2b1);
      psVar2 = (string *)cppcms::json::value::operator[](psVar2);
      std::operator+(&local_288,type,"_key_file");
      pcVar3 = (copyable *)cppcms::json::value::operator[](psVar2);
      cppcms::json::value::copyable::operator=(pcVar3,&local_2b0.d);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)local_2a8);
      cppcms::json::value::copyable::~copyable(&local_2b0.d);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
      poVar4 = std::operator<<(poVar4,(string *)file);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::ofstream::~ofstream(&f);
    if ((uVar1 & 5) != 0) {
      bVar5 = false;
      goto LAB_00102723;
    }
  }
  bVar5 = true;
LAB_00102723:
  std::__cxx11::string::~string((string *)&key);
  return bVar5;
}

Assistant:

bool make_entry(cppcms::json::value &val,std::string type,std::string algo,std::string file,int bytes)
{
	val["session"]["client"][type]=algo;
	std::string key=make_key(bytes);
	if(!file.empty()) {
		std::ofstream f(file.c_str());
		if(!f) {
			std::cerr << "Failed to open file " << file << std::endl;
			return false;
		}
		f << key << std::endl;
		f.close();
		val["session"]["client"][type +"_key_file"]=file;
	}
	else {
		val["session"]["client"][type+"_key"] = key;
	}
	return true;
}